

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O1

void __thiscall
ScenePreprocessorTest_testAnimationPreprocessingPos_Test::
~ScenePreprocessorTest_testAnimationPreprocessingPos_Test
          (ScenePreprocessorTest_testAnimationPreprocessingPos_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testAnimationPreprocessingPos) {
    aiAnimation* p = MakeDummyAnimation();
    aiNodeAnim* anim = p->mChannels[0];

    // we don't set the animation duration, but generate scaling channels
    anim->mNumScalingKeys = 10;
    anim->mScalingKeys = new aiVectorKey[10];

    for (unsigned int i = 0; i < 10;++i)    {
        anim->mScalingKeys[i].mTime = i;
        anim->mScalingKeys[i].mValue = aiVector3D((float)i);
    }
    ProcessAnimation(p);

    // we should now have a proper duration
    EXPECT_NEAR(p->mDuration, 9., 0.005);

    // ... one scaling key
    EXPECT_TRUE(anim->mNumPositionKeys == 1 &&
        anim->mPositionKeys &&
        anim->mPositionKeys[0].mTime == 0.0 &&
        anim->mPositionKeys[0].mValue == aiVector3D(1.f,2.f,3.f));

    // ... and one rotation key
    EXPECT_TRUE(anim->mNumRotationKeys == 1 && anim->mRotationKeys &&
        anim->mRotationKeys[0].mTime == 0.0);

    delete p;
}